

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# POMDPDiscrete.cpp
# Opt level: O1

void __thiscall
POMDPDiscrete::POMDPDiscrete(POMDPDiscrete *this,string *name,string *descr,string *pf)

{
  *(undefined8 *)&(this->super_DecPOMDPDiscrete).field_0x220 = 0x5ddd90;
  *(undefined8 *)&(this->super_DecPOMDPDiscrete).field_0x228 = 0x5ddfe8;
  DecPOMDPDiscrete::DecPOMDPDiscrete
            (&this->super_DecPOMDPDiscrete,&PTR_construction_vtable_96__005dcad8,name,descr,pf);
  *(undefined8 *)
   &(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
    super_MultiAgentDecisionProcess = 0x5dc300;
  *(undefined8 *)&(this->super_DecPOMDPDiscrete).field_0x220 = 0x5dc700;
  *(undefined8 *)&(this->super_DecPOMDPDiscrete).field_0x228 = 0x5dc958;
  *(undefined8 *)&(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.field_0x200
       = 0x5dc578;
  MultiAgentDecisionProcess::SetNrAgents((MultiAgentDecisionProcess *)this,1);
  return;
}

Assistant:

POMDPDiscrete::POMDPDiscrete(const std::string &name,
                             const std::string &descr,
                             const std::string &pf) :
    DecPOMDPDiscrete(name,descr,pf)
{
    this->SetNrAgents(1);
}